

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O3

void __thiscall flow::Value::~Value(Value *this)

{
  pointer ppIVar1;
  pointer pcVar2;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view format_str;
  string local_70;
  string local_50;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_0019d550;
  ppIVar1 = (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar1 !=
      (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,", ","");
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    join<std::vector<flow::Instr*,std::allocator<flow::Instr*>>>
              (&local_50,&this->uses_,&local_70,0x14f3be);
    format_str.size_ = (size_t)&local_50;
    format_str.data_ = (char *)0x2d;
    fmt::v5::format<std::__cxx11::string>
              ((string *)&stack0xffffffffffffffd0,
               (v5 *)"Value being destroyed is still in use by: {}.",format_str,args);
    ~Value((Value *)&stack0xffffffffffffffd0);
    __clang_call_terminate(extraout_RAX);
  }
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)(this->uses_).
                                  super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar1)
    ;
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar3 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Value::~Value() {
  FLOW_ASSERT(!isUsed(), fmt::format(
              "Value being destroyed is still in use by: {}.",
              join(uses_, ", ", &Instr::name)));
}